

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_query.cpp
# Opt level: O1

void __thiscall
HtmlFormParser_one_key_and_value_trailing_Test::~HtmlFormParser_one_key_and_value_trailing_Test
          (HtmlFormParser_one_key_and_value_trailing_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(HtmlFormParser, one_key_and_value_trailing) {
	std::vector<std::pair<std::u8string_view, std::u8string_view>> parsed_result;
	std::u8string query_text = u8"key=value&";
	EXPECT_TRUE(jessilib::deserialize_html_form(parsed_result, query_text));
	EXPECT_TRUE(query_text.starts_with(u8"keyvalue"));
	EXPECT_EQ(parsed_result.size(), 2);
	EXPECT_EQ(parsed_result[0].first, u8"key");
	EXPECT_EQ(parsed_result[0].second, u8"value");
	EXPECT_TRUE(parsed_result[1].first.empty());
	EXPECT_TRUE(parsed_result[1].second.empty());
}